

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DGXMLScanner::scanEndTag(DGXMLScanner *this,bool *gotData)

{
  ReaderMgr *this_00;
  uint uVar1;
  XMLSize_t XVar2;
  XMLElementDecl *pXVar3;
  XMLDocumentHandler *pXVar4;
  bool bVar5;
  XMLCh XVar6;
  int iVar7;
  uint *puVar8;
  StackElem *pSVar9;
  XMLCh *pXVar10;
  XMLCh *text2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RuntimeException *this_01;
  Codes toEmit;
  XMLValidator *pXVar11;
  XMLSize_t failure;
  ulong local_38;
  undefined4 extraout_var;
  
  *gotData = true;
  XVar2 = (this->super_XMLScanner).fElemStack.fStackTop;
  if (XVar2 == 0) {
    XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
    do {
      XVar6 = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
      if (XVar6 == L'>') break;
    } while (XVar6 != L'\0');
    this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x24f,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
  }
  if ((this->super_XMLScanner).fDoNamespaces == true) {
    puVar8 = &(this->super_XMLScanner).fElemStack.fStack[XVar2 - 1]->fCurrentURI;
  }
  else {
    puVar8 = &(this->super_XMLScanner).fEmptyNamespaceId;
  }
  uVar1 = *puVar8;
  pSVar9 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
  pXVar3 = pSVar9->fThisElement;
  XVar2 = (this->super_XMLScanner).fElemStack.fStackTop;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  pXVar10 = QName::getRawName(pXVar3->fElementName);
  bVar5 = XMLReader::skippedStringLong((this->super_XMLScanner).fReaderMgr.fCurReader,pXVar10);
  if (!bVar5) {
    pXVar10 = QName::getRawName(pXVar3->fElementName);
    XMLScanner::emitError
              (&this->super_XMLScanner,ExpectedEndOfTagX,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
    do {
      XVar6 = ReaderMgr::getNextChar(this_00);
      if (XVar6 == L'\0') {
        return;
      }
    } while (XVar6 != L'>');
    return;
  }
  if (pSVar9->fReaderNum != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
    XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
  }
  ReaderMgr::skipPastSpaces(this_00);
  bVar5 = ReaderMgr::skippedChar(this_00,L'>');
  if (!bVar5) {
    pXVar10 = QName::getRawName(pSVar9->fThisElement->fElementName);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedEndTag,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if ((this->super_XMLScanner).fValidate != true) goto LAB_0029dcec;
  if ((pSVar9->fCommentOrPISeen == true) && (*(int *)&pSVar9->fThisElement->field_0x2c == 0)) {
    pXVar11 = (this->super_XMLScanner).fValidator;
    pXVar10 = QName::getRawName(pSVar9->fThisElement->fElementName);
    XMLValidator::emitError
              (pXVar11,EmptyElemHasContent,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  if ((pSVar9->fReferenceEscaped == true) && (*(int *)&pSVar9->fThisElement->field_0x2c == 3)) {
    pXVar11 = (this->super_XMLScanner).fValidator;
    pXVar10 = QName::getRawName(pSVar9->fThisElement->fElementName);
    XMLValidator::emitError
              (pXVar11,ElemChildrenHasInvalidWS,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  pXVar11 = (this->super_XMLScanner).fValidator;
  iVar7 = (*pXVar11->_vptr_XMLValidator[2])(pXVar11,pSVar9->fThisElement,pSVar9->fChildren);
  if ((char)iVar7 != '\0') goto LAB_0029dcec;
  if (pSVar9->fChildCount == 0) {
    pXVar11 = (this->super_XMLScanner).fValidator;
    iVar7 = (*(pSVar9->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
    pXVar10 = (XMLCh *)CONCAT44(extraout_var_00,iVar7);
    toEmit = EmptyNotValidForContent;
LAB_0029dcdc:
    text2 = (XMLCh *)0x0;
  }
  else {
    pXVar11 = (this->super_XMLScanner).fValidator;
    if (pSVar9->fChildCount <= local_38) {
      iVar7 = (*(pSVar9->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
      pXVar10 = (XMLCh *)CONCAT44(extraout_var_01,iVar7);
      toEmit = NotEnoughElemsForCM;
      goto LAB_0029dcdc;
    }
    pXVar10 = QName::getRawName(pSVar9->fChildren[local_38]);
    iVar7 = (*(pSVar9->fThisElement->super_XSerializable)._vptr_XSerializable[0xd])();
    text2 = (XMLCh *)CONCAT44(extraout_var,iVar7);
    toEmit = ElementNotValidForContent;
  }
  XMLValidator::emitError(pXVar11,toEmit,pXVar10,text2,(XMLCh *)0x0,(XMLCh *)0x0);
LAB_0029dcec:
  pXVar4 = (this->super_XMLScanner).fDocHandler;
  if (pXVar4 != (XMLDocumentHandler *)0x0) {
    if ((this->super_XMLScanner).fDoNamespaces == true) {
      pXVar10 = pSVar9->fThisElement->fElementName->fPrefix;
    }
    else {
      pXVar10 = L"";
    }
    (*pXVar4->_vptr_XMLDocumentHandler[6])
              (pXVar4,pSVar9->fThisElement,(ulong)uVar1,(ulong)(XVar2 == 0),pXVar10);
  }
  *gotData = XVar2 != 0;
  return;
}

Assistant:

void DGXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    const ElemStack::StackElem* topElem = fElemStack.popTop();
    XMLElementDecl *tempElement = topElem->fThisElement;

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    // Make sure that its the end of the element that we expect
    if (!fReaderMgr.skippedStringLong(tempElement->getFullName()))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , tempElement->getFullName()
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    //  If validation is enabled, then lets pass him the list of children and
    //  this element and let him validate it.
    if (fValidate)
    {

       //
       // XML1.0-3rd
       // Validity Constraint:
       // The declaration matches EMPTY and the element has no content (not even
       // entity references, comments, PIs or white space).
       //
       if ( (topElem->fCommentOrPISeen)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Empty))
       {
           fValidator->emitError
               (
               XMLValid::EmptyElemHasContent
               , topElem->fThisElement->getFullName()
               );
       }

       //
       // XML1.0-3rd
       // Validity Constraint:
       //
       // The declaration matches children and the sequence of child elements
       // belongs to the language generated by the regular expression in the
       // content model, with optional white space, comments and PIs
       // (i.e. markup matching production [27] Misc) between the start-tag and
       // the first child element, between child elements, or between the last
       // child element and the end-tag.
       //
       // Note that
       //    a CDATA section containing only white space or
       //    a reference to an entity whose replacement text is character references
       //       expanding to white space do not match the nonterminal S, and hence
       //       cannot appear in these positions; however,
       //    a reference to an internal entity with a literal value consisting
       //       of character references expanding to white space does match S,
       //       since its replacement text is the white space resulting from expansion
       //       of the character references.
       //
       if ( (topElem->fReferenceEscaped)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Children))
       {
           fValidator->emitError
               (
               XMLValid::ElemChildrenHasInvalidWS
               , topElem->fThisElement->getFullName()
               );
       }

        XMLSize_t failure;
        bool res = fValidator->checkContent
        (
            topElem->fThisElement
            , topElem->fChildren
            , topElem->fChildCount
            , &failure
        );

        if (!res)
        {
            //  One of the elements is not valid for the content. NOTE that
            //  if no children were provided but the content model requires
            //  them, it comes back with a zero value. But we cannot use that
            //  to index the child array in this case, and have to put out a
            //  special message.
            if (!topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::EmptyNotValidForContent
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else if (failure >= topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::NotEnoughElemsForCM
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , topElem->fChildren[failure]->getRawName()
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
        }
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , (fDoNamespaces)
                ? topElem->fThisElement->getElementName()->getPrefix()
                : XMLUni::fgZeroLenString
        );
    }

    // If this was the root, then done with content
    gotData = !isRoot;
}